

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_parse.c
# Opt level: O2

class_type parse_class_type(char *str)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  ppcVar2 = class_types;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x18) {
      return CLASS_NONE;
    }
    iVar1 = strcmp(str,*ppcVar2);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
    ppcVar2 = ppcVar2 + 1;
  }
  return (class_type)lVar3;
}

Assistant:

enum class_type parse_class_type(const char *str)
{
	enum class_type result = CLASS_LEC;
	size_t i;

	for (i = 0; class_types[i]; i++, result++) {
		if (!strcmp(str, class_types[i])) {
			return result;
		}
	}

	return CLASS_NONE;
}